

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::cb(GB *this)

{
  u16 addr;
  ulong uVar1;
  u8 uVar2;
  
  uVar1 = (this->s).op_tick;
  if (uVar1 < 0xf) {
    if ((0x1540UL >> (uVar1 & 0x3f) & 1) != 0) {
      return;
    }
    if (uVar1 == 0xe) {
      addr = (this->s).pc;
      (this->s).pc = addr + 1;
      uVar2 = Read(this,addr);
      (this->s).cb_op = uVar2;
    }
  }
  (*(code *)(&DAT_0010d478 + *(int *)(&DAT_0010d478 + (ulong)(this->s).cb_op * 4)))();
  return;
}

Assistant:

void GB::cb() {
  switch (s.op_tick) {
    case 6: case 8: case 10: case 12:
      break;
    case 14:
      s.cb_op = read_n();
      // Fallthrough.
    default:
      switch (s.cb_op) {
        REG_OPS(0x00, rlc)
        REG_OPS(0x08, rrc)
        REG_OPS(0x10, rl)
        REG_OPS(0x18, rr)
        REG_OPS(0x20, sla)
        REG_OPS(0x28, sra)
        REG_OPS(0x30, swap)
        REG_OPS(0x38, srl)
        REG_OPS_N(0x40, bit, 0)
        REG_OPS_N(0x48, bit, 1)
        REG_OPS_N(0x50, bit, 2)
        REG_OPS_N(0x58, bit, 3)
        REG_OPS_N(0x60, bit, 4)
        REG_OPS_N(0x68, bit, 5)
        REG_OPS_N(0x70, bit, 6)
        REG_OPS_N(0x78, bit, 7)
        REG_OPS_N(0x80, res, 0)
        REG_OPS_N(0x88, res, 1)
        REG_OPS_N(0x90, res, 2)
        REG_OPS_N(0x98, res, 3)
        REG_OPS_N(0xa0, res, 4)
        REG_OPS_N(0xa8, res, 5)
        REG_OPS_N(0xb0, res, 6)
        REG_OPS_N(0xb8, res, 7)
        REG_OPS_N(0xc0, set, 0)
        REG_OPS_N(0xc8, set, 1)
        REG_OPS_N(0xd0, set, 2)
        REG_OPS_N(0xd8, set, 3)
        REG_OPS_N(0xe0, set, 4)
        REG_OPS_N(0xe8, set, 5)
        REG_OPS_N(0xf0, set, 6)
        REG_OPS_N(0xf8, set, 7)
      }
      break;
  }
}